

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

_Bool extract_if_dead(connectdata *conn,Curl_easy *data)

{
  long lVar1;
  undefined1 auVar2 [12];
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  _Bool _Var7;
  uint uVar8;
  timediff_t tVar9;
  byte bVar10;
  char *fmt;
  curltime older;
  curltime older_00;
  curltime newer;
  curltime cVar11;
  _Bool input_pending;
  _Bool local_29;
  
  if ((conn->easyq).size != 0) {
    return false;
  }
  cVar11 = Curl_now();
  uVar3 = (conn->lastused).tv_sec;
  uVar4 = (conn->lastused).tv_usec;
  older.tv_usec = uVar4;
  older.tv_sec = uVar3;
  older._12_4_ = 0;
  auVar2 = cVar11._0_12_;
  cVar11._12_4_ = 0;
  cVar11.tv_sec = auVar2._0_8_;
  cVar11.tv_usec = auVar2._8_4_;
  tVar9 = Curl_timediff(cVar11,older);
  if ((data->set).maxage_conn < tVar9 / 1000) {
    bVar10 = 1;
    if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8bd & 0x10) == 0)) goto LAB_005cac02;
    fmt = "Too old connection (%ld seconds idle), disconnect it";
  }
  else {
    uVar5 = (conn->created).tv_sec;
    uVar6 = (conn->created).tv_usec;
    older_00.tv_usec = uVar6;
    older_00.tv_sec = uVar5;
    older_00._12_4_ = 0;
    newer._12_4_ = 0;
    newer.tv_sec = auVar2._0_8_;
    newer.tv_usec = auVar2._8_4_;
    tVar9 = Curl_timediff(newer,older_00);
    lVar1 = (data->set).maxlifetime_conn;
    if ((lVar1 == 0) || (tVar9 / 1000 <= lVar1)) {
      if (conn->handler->connection_check == (_func_uint_Curl_easy_ptr_connectdata_ptr_uint *)0x0) {
        Curl_attach_connection(data,conn);
        _Var7 = Curl_conn_is_alive(data,conn,&local_29);
        bVar10 = !_Var7 | local_29;
      }
      else {
        Curl_attach_connection(data,conn);
        uVar8 = (*conn->handler->connection_check)(data,conn,1);
        bVar10 = (byte)uVar8;
      }
      Curl_detach_connection(data);
      goto LAB_005cac02;
    }
    bVar10 = 1;
    if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8bd & 0x10) == 0)) goto LAB_005cac02;
    fmt = "Too old connection (%ld seconds since creation), disconnect it";
  }
  bVar10 = 1;
  Curl_infof(data,fmt);
LAB_005cac02:
  if ((bVar10 & 1) != 0) {
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"Connection %ld seems to be dead",conn->connection_id);
    }
    Curl_conncache_remove_conn(data,conn,false);
    if ((bVar10 & 1) != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool extract_if_dead(struct connectdata *conn,
                            struct Curl_easy *data)
{
  if(!CONN_INUSE(conn)) {
    /* The check for a dead socket makes sense only if the connection isn't in
       use */
    bool dead;
    struct curltime now = Curl_now();
    if(conn_maxage(data, conn, now)) {
      /* avoid check if already too old */
      dead = TRUE;
    }
    else if(conn->handler->connection_check) {
      /* The protocol has a special method for checking the state of the
         connection. Use it to check if the connection is dead. */
      unsigned int state;

      /* briefly attach the connection to this transfer for the purpose of
         checking it */
      Curl_attach_connection(data, conn);

      state = conn->handler->connection_check(data, conn, CONNCHECK_ISDEAD);
      dead = (state & CONNRESULT_DEAD);
      /* detach the connection again */
      Curl_detach_connection(data);

    }
    else {
      bool input_pending;

      Curl_attach_connection(data, conn);
      dead = !Curl_conn_is_alive(data, conn, &input_pending);
      if(input_pending) {
        /* For reuse, we want a "clean" connection state. The includes
         * that we expect - in general - no waiting input data. Input
         * waiting might be a TLS Notify Close, for example. We reject
         * that.
         * For protocols where data from other end may arrive at
         * any time (HTTP/2 PING for example), the protocol handler needs
         * to install its own `connection_check` callback.
         */
        dead = TRUE;
      }
      Curl_detach_connection(data);
    }

    if(dead) {
      infof(data, "Connection %" CURL_FORMAT_CURL_OFF_T " seems to be dead",
            conn->connection_id);
      Curl_conncache_remove_conn(data, conn, FALSE);
      return TRUE;
    }
  }
  return FALSE;
}